

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v5::internal::
     parse_format_string<true,char,fmt::v5::internal::format_string_checker<char,fmt::v5::internal::error_handler,char[5]>&>
               (basic_string_view<char> format_str,
               format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]> *handler)

{
  uint *puVar1;
  bool bVar2;
  format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]> *this;
  size_t sVar3;
  format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]> *pfVar4;
  format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]> *in_RDX;
  char c;
  char *p;
  char *end;
  char *begin;
  writer write;
  undefined7 in_stack_ffffffffffffffa8;
  char in_stack_ffffffffffffffaf;
  undefined7 in_stack_ffffffffffffffb8;
  char in_stack_ffffffffffffffbf;
  format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]> *in_stack_ffffffffffffffc0;
  format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]> *pfVar5;
  format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]> *local_38;
  format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]> *local_30;
  format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]> *handler_00;
  format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]> *pfVar6;
  basic_string_view<char> local_10;
  
  pfVar6 = in_RDX;
  this = (format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]> *)
         basic_string_view<char>::data(&local_10);
  pfVar5 = this;
  sVar3 = basic_string_view<char>::size(&local_10);
  local_30 = (format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]> *)
             ((long)this->parse_funcs_ + (sVar3 - 0x20));
  local_38 = pfVar5;
  do {
    if (local_38 == local_30) {
      return;
    }
    pfVar5 = in_stack_ffffffffffffffc0;
    handler_00 = local_38;
    if (((char)local_38->arg_id_ != '{') &&
       (bVar2 = find<true,char,char_const*>
                          ((char *)local_38,(char *)local_30,'{',(char **)&local_38),
       pfVar5 = in_stack_ffffffffffffffc0, !bVar2)) {
      parse_format_string<true,_char,_fmt::v5::internal::format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]>_&>
      ::writer::operator()
                ((writer *)in_stack_ffffffffffffffc0,
                 (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),(char *)this)
      ;
      return;
    }
    in_stack_ffffffffffffffc0 = pfVar6;
    parse_format_string<true,_char,_fmt::v5::internal::format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]>_&>
    ::writer::operator()
              ((writer *)pfVar5,
               (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),(char *)this);
    pfVar4 = (format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]> *)
             ((long)&local_38->arg_id_ + 1);
    if (pfVar4 == local_30) {
      local_38 = pfVar4;
      format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]>::on_error
                (this,(char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
      return;
    }
    if ((char)pfVar4->arg_id_ == '}') {
      local_38 = pfVar4;
      format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]>::on_arg_id(this);
      pfVar6 = in_stack_ffffffffffffffc0;
      format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]>::on_replacement_field
                (in_stack_ffffffffffffffc0,(char *)local_38);
      in_stack_ffffffffffffffc0 = pfVar5;
    }
    else {
      pfVar6 = in_stack_ffffffffffffffc0;
      if ((char)pfVar4->arg_id_ == '{') {
        puVar1 = &local_38->arg_id_;
        local_38 = pfVar4;
        format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]>::on_text
                  (in_stack_ffffffffffffffc0,(char *)pfVar4,(char *)((long)puVar1 + 2));
        in_stack_ffffffffffffffc0 = pfVar5;
      }
      else {
        local_38 = pfVar4;
        local_38 = (format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]> *)
                   parse_arg_id<char,fmt::v5::internal::id_adapter<fmt::v5::internal::format_string_checker<char,fmt::v5::internal::error_handler,char[5]>&,char>>
                             ((char *)in_stack_ffffffffffffffc0,(char *)in_RDX,
                              (id_adapter<fmt::v5::internal::format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]>_&,_char>
                               *)handler_00);
        if (local_38 == local_30) {
          in_stack_ffffffffffffffaf = '\0';
        }
        else {
          in_stack_ffffffffffffffaf = (char)local_38->arg_id_;
        }
        in_stack_ffffffffffffffbf = in_stack_ffffffffffffffaf;
        if (in_stack_ffffffffffffffaf == '}') {
          format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]>::
          on_replacement_field(pfVar6,(char *)local_38);
        }
        else {
          if (in_stack_ffffffffffffffaf != ':') {
            format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]>::on_error
                      (this,(char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
            return;
          }
          local_38 = (format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]> *)
                     format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]>::
                     on_format_specs(in_stack_ffffffffffffffc0,
                                     (char *)CONCAT17(0x3a,in_stack_ffffffffffffffb8),(char *)this);
          if ((local_38 == local_30) || ((char)local_38->arg_id_ != '}')) {
            format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]>::on_error
                      (this,(char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
            return;
          }
        }
      }
    }
    local_38 = (format_string_checker<char,_fmt::v5::internal::error_handler,_char[5]> *)
               ((long)&local_38->arg_id_ + 1);
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}